

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-multicast.c
# Opt level: O1

int mc_packremote(lua_State *L)

{
  int iVar1;
  void *__src;
  ulong __size;
  void *__dest;
  
  __src = lua_touserdata(L,1);
  __size = luaL_checkinteger(L,2);
  if (__size >> 0x20 == 0) {
    __dest = malloc(__size);
    memcpy(__dest,__src,__size);
    pack(L,__dest,__size);
    return 2;
  }
  iVar1 = luaL_error(L,"Size should be 32bit integer");
  return iVar1;
}

Assistant:

static int
mc_packremote(lua_State *L) {
	void * data = lua_touserdata(L, 1);
	size_t size = (size_t)luaL_checkinteger(L, 2);
	if (size != (uint32_t)size) {
		return luaL_error(L, "Size should be 32bit integer");
	}
	void * msg = skynet_malloc(size);
	memcpy(msg, data, size);
	return pack(L, msg, size);
}